

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmsrcf.cpp
# Opt level: O0

CVmSrcfEntry * __thiscall CVmSrcfTable::add_entry(CVmSrcfTable *this,int orig_index,size_t name_len)

{
  CVmSrcfEntry *name_len_00;
  void *pvVar1;
  long *in_RDI;
  size_t siz;
  CVmSrcfEntry *entry;
  undefined8 in_stack_ffffffffffffffc8;
  CVmSrcfEntry *in_stack_ffffffffffffffd0;
  
  name_len_00 = (CVmSrcfEntry *)operator_new(0x28);
  CVmSrcfEntry::CVmSrcfEntry
            (in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
             (int)in_stack_ffffffffffffffc8,(size_t)name_len_00);
  if ((ulong)in_RDI[2] <= (ulong)in_RDI[1]) {
    in_RDI[2] = in_RDI[2] + 10;
    if (*in_RDI == 0) {
      pvVar1 = malloc(in_RDI[2] << 3);
      *in_RDI = (long)pvVar1;
    }
    else {
      pvVar1 = realloc((void *)*in_RDI,in_RDI[2] << 3);
      *in_RDI = (long)pvVar1;
    }
  }
  *(CVmSrcfEntry **)(*in_RDI + in_RDI[1] * 8) = name_len_00;
  in_RDI[1] = in_RDI[1] + 1;
  return name_len_00;
}

Assistant:

CVmSrcfEntry *CVmSrcfTable::add_entry(int orig_index, size_t name_len)
{
    CVmSrcfEntry *entry;
    
    /* allocate the new entry */
    entry = new CVmSrcfEntry(orig_index, (uint)orig_index == list_used_,
                             name_len);

    /* 
     *   make sure we have room in our list for a new entry; if not,
     *   expand the list 
     */
    if (list_used_ >= list_alloc_)
    {
        size_t siz;
        
        /* calculate the expanded list size */
        list_alloc_ += 10;
        siz = list_alloc_ * sizeof(list_[0]);

        /* allocate or reallocate the list */
        if (list_ == 0)
            list_ = (CVmSrcfEntry **)t3malloc(siz);
        else
            list_ = (CVmSrcfEntry **)t3realloc(list_, siz);
    }

    /* add the new entry */
    list_[list_used_] = entry;

    /* count the new entry */
    ++list_used_;

    /* return the new entry */
    return entry;
}